

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O0

RealType sSTOCoulInt(RealType a,RealType b,int m,int n,RealType R)

{
  int in_ESI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  __type _Var3;
  __type _Var4;
  __type _Var5;
  double dVar6;
  RealType RVar7;
  double dVar8;
  double dVar9;
  RealType RVar10;
  double dVar11;
  double in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  int p_1;
  int nu_2;
  int p;
  int nu_1;
  int nu;
  RealType Term2;
  RealType Term1;
  RealType sSTOCoulInt_;
  RealType epsilon;
  RealType epsi;
  RealType eps;
  RealType OneElectronTerm;
  RealType Term;
  RealType Factor2;
  RealType Factor1;
  RealType K2;
  RealType x;
  undefined8 in_stack_fffffffffffffed8;
  int __y;
  RealType in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  double in_stack_fffffffffffffef0;
  RealType in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  double local_80;
  double local_70;
  double local_30;
  
  dVar9 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  dVar1 = in_XMM0_Qa * 2.0 * dVar9;
  local_70 = 0.0;
  dVar2 = std::numeric_limits<double>::epsilon();
  __y = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  if (dVar2 <= ABS(dVar1)) {
    dVar6 = 1.0 / dVar9;
    _Var3 = std::pow<double,int>(in_stack_fffffffffffffee0,__y);
    dVar2 = fact[in_EDI << 1];
    RVar7 = RosenA((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_fffffffffffffef8);
    dVar8 = exp(-dVar1);
    dVar9 = (_Var3 / (dVar2 * dVar9)) * ((dVar1 - (double)(in_EDI << 1)) * RVar7 + -dVar8) + dVar6 +
            0.0;
    dVar1 = 0.0 / dVar9;
    if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
      dVar2 = -in_XMM0_Qa;
      _Var3 = std::pow<double,int>(in_stack_fffffffffffffee0,__y);
      dVar8 = (dVar2 * _Var3) / ((double)in_ESI * 2.0 * fact[in_EDI << 1]);
      if ((in_XMM1_Qa != 0.0) || (NAN(in_XMM1_Qa))) {
        for (local_90 = 0; local_90 <= in_ESI * 2 + -1; local_90 = local_90 + 1) {
          local_30 = 0.0;
          for (local_94 = 0; local_94 <= in_EDI * 2 + local_90 + -1; local_94 = local_94 + 1) {
            in_stack_fffffffffffffee0 =
                 RosenD((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                        SUB84(in_stack_fffffffffffffef0,0),(int)((ulong)local_30 >> 0x20));
            RVar10 = RosenB((int)((ulong)dVar6 >> 0x20),RVar7);
            in_stack_fffffffffffffef0 = in_stack_fffffffffffffee0 * RVar10;
            RVar10 = RosenA((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),dVar2);
            local_30 = in_stack_fffffffffffffef0 * RVar10 + local_30;
          }
          dVar11 = (local_30 * (double)(in_ESI * 2 - local_90)) / fact[local_90];
          _Var3 = std::pow<double,int>(in_stack_fffffffffffffee0,(int)((ulong)dVar11 >> 0x20));
          dVar11 = dVar11 * _Var3;
          local_70 = dVar11 + local_70;
          if (ABS(dVar11) < dVar1 / ABS(dVar8)) break;
        }
        local_70 = dVar8 * local_70;
      }
      else {
        printf("WARNING: b = 0 in sSTOCoulInt\n");
      }
    }
    else {
      _Var3 = std::pow<double,int>(in_stack_fffffffffffffee0,__y);
      dVar2 = (-in_XMM0_Qa * _Var3) / ((double)in_ESI * fact[in_EDI << 1]);
      for (local_88 = 0; local_88 <= in_ESI * 2 + -1; local_88 = local_88 + 1) {
        dVar6 = fact[local_88];
        _Var3 = std::pow<double,int>(in_stack_fffffffffffffee0,__y);
        dVar6 = (((double)in_ESI + (double)in_ESI + -(double)local_88) / dVar6) * _Var3;
        local_30 = 0.0;
        for (local_8c = 0; local_8c <= in_EDI + (local_88 + -1) / 2; local_8c = local_8c + 1) {
          RVar7 = RosenD((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                         SUB84(in_stack_fffffffffffffef0,0),
                         (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
          dVar8 = RVar7 / ((double)local_8c + (double)local_8c + 1.0);
          RVar7 = RosenA((int)((ulong)dVar8 >> 0x20),in_stack_fffffffffffffef8);
          dVar8 = dVar8 * RVar7;
          local_30 = dVar8 + local_30;
          if ((0.0 < dVar8) && (dVar8 < dVar1 / ABS(dVar2 * dVar6))) goto LAB_003b0e35;
        }
        local_70 = local_30 * dVar6 + local_70;
      }
LAB_003b0e35:
      local_70 = dVar2 * local_70;
    }
    local_70 = dVar9 + local_70;
  }
  else {
    dVar9 = fact[in_EDI * 2 + -1];
    _Var3 = std::pow<double,int>(in_stack_fffffffffffffee0,__y);
    local_80 = 0.0;
    for (local_84 = 1;
        local_84 == in_ESI * 2 || SBORROW4(local_84,in_ESI * 2) != local_84 + in_ESI * -2 < 0;
        local_84 = local_84 + 1) {
      _Var4 = std::pow<double,int>(in_stack_fffffffffffffee0,__y);
      dVar1 = fact[((in_EDI + in_ESI) * 2 - local_84) + -1];
      dVar2 = fact[in_ESI * 2 - local_84];
      _Var5 = std::pow<double,int>(in_stack_fffffffffffffee0,__y);
      local_80 = ((double)local_84 * _Var4 * dVar1) / (dVar2 * 2.0 * (double)in_ESI * _Var5) +
                 local_80;
    }
    _Var4 = std::pow<double,int>(in_stack_fffffffffffffee0,__y);
    local_70 = (_Var4 * (dVar9 / _Var3 - local_80)) / fact[in_EDI << 1];
  }
  return local_70;
}

Assistant:

inline RealType sSTOCoulInt(RealType a, RealType b, int m, int n, RealType R) {
  RealType x, K2;
  RealType Factor1, Factor2, Term, OneElectronTerm;
  RealType eps, epsi;

  // To speed up calculation, we terminate loop once contributions
  // to integral fall below the bound, epsilon
  RealType epsilon = 0.;

  // x is the argument of the auxiliary RosenA and RosenB functions
  x = 2. * a * R;

  // First compute the two-electron component
  RealType sSTOCoulInt_ = 0.;
  if (std::fabs(x) <
      std::numeric_limits<RealType>::epsilon())  // Pathological case
  {
    // This solution for the one-center coulomb integrals comes from
    // Yoshiyuki Hase, Computers & Chemistry 9(4), pp. 285-287 (1985).

    RealType Term1 = fact[2 * m - 1] / pow(2 * a, 2 * m);
    RealType Term2 = 0.;
    for (int nu = 1; nu <= 2 * n; nu++) {
      Term2 += nu * pow(2 * b, 2 * n - nu) * fact[2 * (m + n) - nu - 1] /
               (fact[2 * n - nu] * 2 * n * pow(2 * (a + b), 2 * (m + n) - nu));
    }
    sSTOCoulInt_ = pow(2 * a, 2 * m + 1) * (Term1 - Term2) / fact[2 * m];

    // Original QTPIE code for the one-center case is below.  Doesn't
    // appear to generate the correct one-center results.
    //
    // if ((a==b) && (m==n))
    //   {
    //     for (int nu=0; nu<=2*n-1; nu++)
    //       {
    //         K2 = 0.;
    //         for (unsigned p=0; p<=2*n+m; p++) K2 += 1. / fact[p];
    //         sSTOCoulInt_ += K2 * fact[2*n+m] / fact[m];
    //       }
    //     sSTOCoulInt_ = 2 * a / (n * fact[2*n]) * sSTOCoulInt_;
    //   }
    // else
    //   {
    //     // Not implemented
    //     printf("ERROR, sSTOCoulInt cannot compute from arguments\n");
    //     printf("a = %lf b = %lf m = %d n = %d R = %lf\n",a, b, m, n, R);
    //     exit(0);
    //   }

  } else {
    OneElectronTerm = 1. / R +
                      pow(x, 2 * m) / (fact[2 * m] * R) *
                          ((x - 2 * m) * RosenA(2 * m - 1, x) - exp(-x)) +
                      sSTOCoulInt_;
    eps = epsilon / OneElectronTerm;
    if (a == b) {
      // Apply Rosen (48)
      Factor1 = -a * pow(a * R, 2 * m) / (n * fact[2 * m]);
      for (int nu = 0; nu <= 2 * n - 1; nu++) {
        Factor2 = (2. * n - nu) / fact[nu] * pow(a * R, nu);
        epsi    = eps / fabs(Factor1 * Factor2);
        K2      = 0.;
        for (int p = 0; p <= m + (nu - 1) / 2; p++) {
          Term = RosenD(2 * m - 1, nu, 2 * p) / (2. * p + 1.) *
                 RosenA(2 * m + nu - 1 - 2 * p, x);
          K2 += Term;
          if ((Term > 0) && (Term < epsi)) goto label1;
        }
        sSTOCoulInt_ += K2 * Factor2;
      }
    label1:
      sSTOCoulInt_ *= Factor1;
    } else {
      Factor1 = -a * pow(a * R, 2 * m) / (2. * n * fact[2 * m]);
      epsi    = eps / fabs(Factor1);
      if (b == 0.)
        printf("WARNING: b = 0 in sSTOCoulInt\n");
      else {
        // Apply Rosen (54)
        for (int nu = 0; nu <= 2 * n - 1; nu++) {
          K2 = 0;
          for (int p = 0; p <= 2 * m + nu - 1; p++)
            K2 = K2 + RosenD(2 * m - 1, nu, p) * RosenB(p, R * (a - b)) *
                          RosenA(2 * m + nu - 1 - p, R * (a + b));
          Term = K2 * (2 * n - nu) / fact[nu] * pow(b * R, nu);
          sSTOCoulInt_ += Term;
          if (fabs(Term) < epsi) goto label2;
        }
      label2:
        sSTOCoulInt_ *= Factor1;
      }
    }
    // Now add the one-electron term from Rosen (47) = Rosen (53)
    sSTOCoulInt_ += OneElectronTerm;
  }
  return sSTOCoulInt_;
}